

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_call_method_impl(HSQUIRRELVM v,bool safe)

{
  undefined1 uVar1;
  byte bVar2;
  size_type sVar3;
  ulong uVar4;
  SQObjectPtr *pSVar5;
  SQChar *pSVar6;
  SQRESULT SVar7;
  _HashNode **pp_Var8;
  byte in_SIL;
  HSQUIRRELVM in_RDI;
  SQObjectPtr ret;
  bool t;
  bool s;
  int32_t i_1;
  SQObject arg;
  int32_t i;
  sqvector<SQObjectPtr,_unsigned_int> args;
  SQObjectPtr callee;
  SQObjectType type;
  SQObject delegates;
  SQObject name;
  SQObject obj;
  int32_t nArgs;
  SQChar message [1024];
  SQChar *in_stack_fffffffffffffa88;
  SQVM *in_stack_fffffffffffffa90;
  SQObjectPtr *in_stack_fffffffffffffa98;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  SQTable *in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffae0;
  SQInt32 target;
  undefined6 in_stack_fffffffffffffae8;
  SQObjectValue newbase;
  SQInteger in_stack_fffffffffffffaf8;
  char *pcVar9;
  undefined4 in_stack_fffffffffffffb00;
  SQObjectType SVar10;
  SQVM *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb20;
  uint uVar11;
  uint pos;
  bool *in_stack_fffffffffffffb28;
  SQObject local_4c8;
  int local_4b4;
  SQObjectPtr local_4b0;
  sqvector<SQObjectPtr,_unsigned_int> local_4a0;
  undefined4 local_488;
  SQObjectPtr local_478 [3];
  SQObjectValue local_448;
  SQObject local_440;
  SQObject local_430;
  int local_41c;
  char local_418 [1031];
  byte local_11;
  HSQUIRRELVM local_10;
  SQRESULT local_8;
  
  local_11 = in_SIL & 1;
  local_10 = in_RDI;
  memset(local_418,0,0x400);
  uVar4 = sq_gettop(local_10);
  local_41c = (int)uVar4;
  if (local_41c < 3) {
    if ((local_11 & 1) == 0) {
      snprintf(local_418,0x400,
               "\'__call_method(...)\' recieves at least 2 arguments (%d), object to method on and method\'s name"
               ,uVar4 & 0xffffffff);
      local_8 = sq_throwerror(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
    else {
      SQVM::Pop((SQVM *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                (SQInteger)in_stack_fffffffffffffa98);
      SQVM::PushNull(in_stack_fffffffffffffa90);
      local_8 = 1;
    }
  }
  else {
    pSVar5 = stack_get(in_stack_fffffffffffffa90,(SQInteger)in_stack_fffffffffffffa88);
    local_430._type = (pSVar5->super_SQObject)._type;
    local_430._flags = (pSVar5->super_SQObject)._flags;
    local_430._5_3_ = *(undefined3 *)&(pSVar5->super_SQObject).field_0x5;
    local_430._unVal = (pSVar5->super_SQObject)._unVal;
    pSVar5 = stack_get(in_stack_fffffffffffffa90,(SQInteger)in_stack_fffffffffffffa88);
    local_440._type = (pSVar5->super_SQObject)._type;
    local_440._flags = (pSVar5->super_SQObject)._flags;
    local_440._5_3_ = *(undefined3 *)&(pSVar5->super_SQObject).field_0x5;
    local_440._unVal = (pSVar5->super_SQObject)._unVal;
    if (local_440._type == OT_STRING) {
      local_478[2].super_SQObject._4_4_ = local_430._type;
      if (((local_430._type == OT_BOOL) || (local_430._type == OT_INTEGER)) ||
         (local_430._type == OT_FLOAT)) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_number_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_number_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_STRING) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_string_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_string_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_ARRAY) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_array_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_array_default_delegate).super_SQObject._unVal;
      }
      else if ((local_430._type == OT_CLOSURE) || (local_430._type == OT_NATIVECLOSURE)) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_closure_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_closure_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_GENERATOR) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_generator_default_delegate).super_SQObject
        ;
        local_448 = (local_10->_sharedstate->_generator_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_THREAD) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_thread_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_thread_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_CLASS) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_class_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_class_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_WEAKREF) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_weakref_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_weakref_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_TABLE) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_table_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_table_default_delegate).super_SQObject._unVal;
      }
      else if (local_430._type == OT_USERDATA) {
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_userdata_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_userdata_default_delegate).super_SQObject._unVal;
      }
      else {
        if (local_430._type != OT_INSTANCE) {
          if ((local_11 & 1) != 0) {
            SQVM::Pop((SQVM *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                      (SQInteger)in_stack_fffffffffffffa98);
            SQVM::PushNull(in_stack_fffffffffffffa90);
            return 1;
          }
          pcVar9 = local_418;
          pSVar6 = IdType2Name(local_430._type);
          snprintf(pcVar9,0x400,
                   "unsupported object type \'%s\' as receiver in \'__call_method(...)\' function",
                   pSVar6);
          SVar7 = sq_throwerror(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          return SVar7;
        }
        local_478[2].super_SQObject._unVal =
             *(SQObjectValue *)&(local_10->_sharedstate->_instance_default_delegate).super_SQObject;
        local_448 = (local_10->_sharedstate->_instance_default_delegate).super_SQObject._unVal;
      }
      SVar10 = local_430._type;
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffa90);
      newbase = local_448;
      SQObjectPtr::SQObjectPtr(local_478,&local_440);
      uVar1 = SQTable::Get(in_stack_fffffffffffffaa8,
                           (SQObjectPtr *)
                           CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                           in_stack_fffffffffffffa98);
      bVar2 = uVar1 ^ 0xff;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffa90);
      if ((bVar2 & 1) == 0) {
        sqvector<SQObjectPtr,_unsigned_int>::sqvector(&local_4a0,local_10->_sharedstate->_alloc_ctx)
        ;
        sqvector<SQObjectPtr,_unsigned_int>::reserve
                  ((sqvector<SQObjectPtr,_unsigned_int> *)in_stack_fffffffffffffa90,
                   (size_type)((ulong)in_stack_fffffffffffffa88 >> 0x20));
        SQObjectPtr::SQObjectPtr(&local_4b0,&local_430);
        sqvector<SQObjectPtr,_unsigned_int>::push_back
                  ((sqvector<SQObjectPtr,_unsigned_int> *)
                   CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                   in_stack_fffffffffffffa98);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffa90);
        for (local_4b4 = 4; local_4b4 <= local_41c; local_4b4 = local_4b4 + 1) {
          pSVar5 = stack_get(in_stack_fffffffffffffa90,(SQInteger)in_stack_fffffffffffffa88);
          local_4c8._type = (pSVar5->super_SQObject)._type;
          local_4c8._flags = (pSVar5->super_SQObject)._flags;
          local_4c8._5_3_ = *(undefined3 *)&(pSVar5->super_SQObject).field_0x5;
          local_4c8._unVal = (pSVar5->super_SQObject)._unVal;
          SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xfffffffffffffb28,&local_4c8);
          sqvector<SQObjectPtr,_unsigned_int>::push_back
                    ((sqvector<SQObjectPtr,_unsigned_int> *)
                     CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                     in_stack_fffffffffffffa98);
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffa90);
        }
        uVar11 = 0;
        while( true ) {
          pos = uVar11;
          sVar3 = sqvector<SQObjectPtr,_unsigned_int>::size(&local_4a0);
          target = (SQInt32)((ulong)in_stack_fffffffffffffae0 >> 0x20);
          if (sVar3 <= uVar11) break;
          sqvector<SQObjectPtr,_unsigned_int>::operator[](&local_4a0,pos);
          SQVM::Push((SQVM *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                     in_stack_fffffffffffffa98);
          uVar11 = pos + 1;
        }
        SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffa90);
        in_stack_fffffffffffffa90 = (SQVM *)&stack0xfffffffffffffb22;
        uVar1 = SQVM::CallNative(in_stack_fffffffffffffb08,
                                 (SQNativeClosure *)CONCAT44(SVar10,in_stack_fffffffffffffb00),
                                 in_stack_fffffffffffffaf8,newbase.nInteger,
                                 (SQObjectPtr *)
                                 CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffae8)),target,
                                 (bool *)CONCAT44(pos,in_stack_fffffffffffffb20),
                                 in_stack_fffffffffffffb28);
        if ((bool)uVar1) {
          SQVM::Pop((SQVM *)CONCAT17(uVar1,in_stack_fffffffffffffaa0),
                    (SQInteger)in_stack_fffffffffffffa98);
          SQVM::Push((SQVM *)CONCAT17(uVar1,in_stack_fffffffffffffaa0),in_stack_fffffffffffffa98);
          local_8 = 1;
        }
        else {
          local_8 = -1;
        }
        local_488 = 1;
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffa90);
        sqvector<SQObjectPtr,_unsigned_int>::~sqvector
                  ((sqvector<SQObjectPtr,_unsigned_int> *)0x12e3fc);
      }
      else if ((local_11 & 1) == 0) {
        pp_Var8 = &(local_440._unVal.pTable)->_firstfree;
        pSVar6 = IdType2Name(local_478[2].super_SQObject._4_4_);
        snprintf(local_418,0x400,"function \'%s\' not found in \'%s\' delegates",pp_Var8,pSVar6);
        local_8 = sq_throwerror(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        local_488 = 1;
      }
      else {
        SQVM::Pop((SQVM *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                  (SQInteger)in_stack_fffffffffffffa98);
        SQVM::PushNull(in_stack_fffffffffffffa90);
        local_8 = 1;
        local_488 = 1;
      }
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffa90);
    }
    else if ((local_11 & 1) == 0) {
      pcVar9 = local_418;
      pSVar6 = IdType2Name(local_440._type);
      snprintf(pcVar9,0x400,
               "\'__call_method(...)\' expects 2nd argument to be string, actual \'%s\'",pSVar6);
      local_8 = sq_throwerror(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    }
    else {
      SQVM::Pop((SQVM *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                (SQInteger)in_stack_fffffffffffffa98);
      SQVM::PushNull(in_stack_fffffffffffffa90);
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

static SQInteger base_call_method_impl(HSQUIRRELVM v, bool safe)
{
    SQChar message[1024] = {0};
    int32_t nArgs = sq_gettop(v);

    if (nArgs < 3)
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' recieves at least 2 arguments (%d), object to method on and method's name"), nArgs);
        return sq_throwerror(v, message);
    }

    SQObject obj = stack_get(v, 2);
    SQObject name = stack_get(v, 3);

    if (!sq_isstring(name))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' expects 2nd argument to be string, actual '%s'"), IdType2Name(sq_type(name)));
        return sq_throwerror(v, message);
    }

    SQObject delegates;
    SQObjectType type = sq_type(obj);
    switch (type)
    {
    case OT_INTEGER:
    case OT_FLOAT:
    case OT_BOOL:
        delegates = _ss(v)->_number_default_delegate;
        break;
    case OT_STRING:
        delegates = _ss(v)->_string_default_delegate;
        break;
    case OT_TABLE:
        delegates = _ss(v)->_table_default_delegate;
        break;
    case OT_ARRAY:
        delegates = _ss(v)->_array_default_delegate;
        break;
    case OT_USERDATA:
        delegates = _ss(v)->_userdata_default_delegate;
        break;
    case OT_CLOSURE:
    case OT_NATIVECLOSURE:
        delegates = _ss(v)->_closure_default_delegate;
        break;
    case OT_GENERATOR:
        delegates = _ss(v)->_generator_default_delegate;
        break;
    case OT_THREAD:
        delegates = _ss(v)->_thread_default_delegate;
        break;
    case OT_CLASS:
        delegates = _ss(v)->_class_default_delegate;
        break;
    case OT_INSTANCE:
        delegates = _ss(v)->_instance_default_delegate;
        break;
    case OT_WEAKREF:
        delegates = _ss(v)->_weakref_default_delegate;
        break;
    default:
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("unsupported object type '%s' as receiver in '__call_method(...)' function"), IdType2Name(type));
        return sq_throwerror(v, message);
    }

    assert(sq_istable(delegates));

    SQObjectPtr callee;
    if (!_table(delegates)->Get(name, callee))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        else
        {
            snprintf(message, sizeof message, _SC("function '%s' not found in '%s' delegates"), _stringval(name), IdType2Name(type));
            return sq_throwerror(v, message);
        }
    }

    assert(sq_isnativeclosure(callee));

    sqvector<SQObjectPtr> args(_ss(v)->_alloc_ctx);

    args.reserve(nArgs - 2);
    args.push_back(obj);

    for (int32_t i = 4; i <= nArgs; ++i) // skip reciever + name
    {
        SQObject arg = stack_get(v, i);
        args.push_back(arg);
    }

    for (int32_t i = 0; i < args.size(); ++i)
    {
        v->Push(args[i]);
    }

    bool s, t;
    SQObjectPtr ret;
    if (!v->CallNative(_nativeclosure(callee), nArgs - 2, v->_stackbase + nArgs, ret, -1, s, t))
    {
        return SQ_ERROR;
    }

    v->Pop(nArgs);
    v->Push(ret);
    return 1;
}